

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void equip_learn_on_ranged_attack(player *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  player_shape *ppVar3;
  wchar_t wVar4;
  
  if (p->obj_k->to_h == 0) {
    for (wVar4 = L'\0'; (uint)wVar4 < (uint)(p->body).count; wVar4 = wVar4 + L'\x01') {
      obj = slot_object(p,wVar4);
      wVar2 = slot_by_name(p,"weapon");
      if ((wVar4 != wVar2) &&
         (wVar2 = slot_by_name(p,"shooting"), obj != (object *)0x0 && wVar4 != wVar2)) {
        if (obj->known == (object *)0x0) {
          __assert_fail("obj->known",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/obj-knowledge.c"
                        ,0x7be,"void equip_learn_on_ranged_attack(struct player *)");
        }
        _Var1 = object_has_standard_to_h(obj);
        if (!_Var1) {
          wVar2 = rune_index(0,L'\x01');
          player_learn_rune(p,(long)wVar2,true);
        }
        object_curses_find_to_h(p,obj);
        if (p->obj_k->to_h != 0) {
          return;
        }
      }
    }
    if ((p->shape != (player_shape *)0x0) &&
       (ppVar3 = lookup_player_shape(p->shape->name), ppVar3->to_h != L'\0')) {
      wVar4 = rune_index(0,L'\x01');
      player_learn_rune(p,(long)wVar4,true);
      return;
    }
  }
  return;
}

Assistant:

void equip_learn_on_ranged_attack(struct player *p)
{
	int i;

	if (p->obj_k->to_h) return;

	for (i = 0; i < p->body.count; i++) {
		struct object *obj = slot_object(p, i);
		if (i == slot_by_name(p, "weapon")) continue;
		if (i == slot_by_name(p, "shooting")) continue;
		if (obj) {
			assert(obj->known);
			if (!object_has_standard_to_h(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
				player_learn_rune(p, index, true);
			}
			object_curses_find_to_h(p, obj);
			if (p->obj_k->to_h) return;
		}
	}
	if (p->shape) {
		struct player_shape *shape = lookup_player_shape(p->shape->name);
		if (shape->to_h != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
			player_learn_rune(p, index, true);
		}
	}
}